

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QSslEllipticCurve>::emplace<QSslEllipticCurve_const&>
          (QPodArrayOps<QSslEllipticCurve> *this,qsizetype i,QSslEllipticCurve *args)

{
  int iVar1;
  Data *pDVar2;
  long lVar3;
  QSslEllipticCurve *pQVar4;
  GrowthPosition where;
  
  pDVar2 = (this->super_QArrayDataPointer<QSslEllipticCurve>).d;
  if ((pDVar2 != (Data *)0x0) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    lVar3 = (this->super_QArrayDataPointer<QSslEllipticCurve>).size;
    if ((lVar3 == i) &&
       (pQVar4 = (this->super_QArrayDataPointer<QSslEllipticCurve>).ptr,
       (pDVar2->super_QArrayData).alloc !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) +
       i)) {
      pQVar4[i].id = args->id;
      (this->super_QArrayDataPointer<QSslEllipticCurve>).size = i + 1;
      return;
    }
    if ((i == 0) &&
       (pQVar4 = (this->super_QArrayDataPointer<QSslEllipticCurve>).ptr,
       (QSslEllipticCurve *)
       ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) != pQVar4)) {
      pQVar4[-1].id = args->id;
      (this->super_QArrayDataPointer<QSslEllipticCurve>).ptr = pQVar4 + -1;
      (this->super_QArrayDataPointer<QSslEllipticCurve>).size = lVar3 + 1;
      return;
    }
  }
  iVar1 = args->id;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QSslEllipticCurve>).size != 0);
  QArrayDataPointer<QSslEllipticCurve>::detachAndGrow
            (&this->super_QArrayDataPointer<QSslEllipticCurve>,where,1,(QSslEllipticCurve **)0x0,
             (QArrayDataPointer<QSslEllipticCurve> *)0x0);
  pQVar4 = createHole(this,where,i,1);
  pQVar4->id = iVar1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }